

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack19_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x7ffff;
  out[1] = uVar1 >> 0x13;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x13 | (uVar2 & 0x3f) << 0xd;
  out[2] = uVar2 >> 6 & 0x7ffff;
  uVar1 = in[2];
  out[3] = uVar2 >> 0x19;
  out[3] = uVar2 >> 0x19 | (uVar1 & 0xfff) << 7;
  out[4] = uVar1 >> 0xc & 0x7ffff;
  uVar2 = in[3];
  out[5] = uVar1 >> 0x1f;
  out[5] = uVar1 >> 0x1f | (uVar2 & 0x3ffff) << 1;
  out[6] = uVar2 >> 0x12;
  uVar1 = in[4];
  out[6] = uVar2 >> 0x12 | (uVar1 & 0x1f) << 0xe;
  out[7] = uVar1 >> 5 & 0x7ffff;
  uVar2 = in[5];
  out[8] = uVar1 >> 0x18;
  out[8] = uVar1 >> 0x18 | (uVar2 & 0x7ff) << 8;
  out[9] = uVar2 >> 0xb & 0x7ffff;
  uVar1 = in[6];
  out[10] = uVar2 >> 0x1e;
  out[10] = uVar2 >> 0x1e | (uVar1 & 0x1ffff) << 2;
  out[0xb] = uVar1 >> 0x11;
  uVar2 = in[7];
  out[0xb] = uVar1 >> 0x11 | (uVar2 & 0xf) << 0xf;
  out[0xc] = uVar2 >> 4 & 0x7ffff;
  uVar1 = in[8];
  out[0xd] = uVar2 >> 0x17;
  out[0xd] = uVar2 >> 0x17 | (uVar1 & 0x3ff) << 9;
  out[0xe] = uVar1 >> 10 & 0x7ffff;
  uVar2 = in[9];
  out[0xf] = uVar1 >> 0x1d;
  out[0xf] = (uVar2 & 0xffff) << 3 | uVar1 >> 0x1d;
  return in + 10;
}

Assistant:

const uint32_t *__fastunpack19_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 6)) << (19 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 19);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 12)) << (19 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 19);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 18)) << (19 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 5)) << (19 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 19);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 11)) << (19 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 19);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 17)) << (19 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 4)) << (19 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 19);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 10)) << (19 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 19);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 16)) << (19 - 16);
  out++;

  return in + 1;
}